

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omnidir_model.hpp
# Opt level: O3

double __thiscall
OmnidirModel::computeReprojectionErrors
          (OmnidirModel *this,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,vector<cv::Mat,_std::allocator<cv::Mat>_> *rvecs,
          vector<cv::Mat,_std::allocator<cv::Mat>_> *tvecs,Mat *idx,Mat *camera_matrix,Mat *xi,
          Mat *distort_coeffs,vector<double,_std::allocator<double>_> *image_reproj_errors)

{
  pointer pvVar1;
  Size SVar2;
  pointer pvVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  _OutputArray *p_Var7;
  ulong uVar8;
  _InputArray *p_Var9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points2;
  double local_1a0;
  _InputArray local_188;
  _InputArray local_170;
  Size local_158;
  long lStack_150;
  undefined8 local_148;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *local_138;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_130;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_128;
  undefined1 local_120 [12];
  undefined4 uStack_114;
  Size local_110;
  Size SStack_108;
  uchar *local_100;
  uchar *puStack_f8;
  MatAllocator *local_f0;
  UMatData *pUStack_e8;
  MatSize local_e0;
  size_t *local_d8;
  size_t local_d0 [2];
  undefined1 local_c0 [12];
  undefined4 uStack_b4;
  Size local_b0;
  Size SStack_a8;
  uchar *local_a0;
  uchar *puStack_98;
  MatAllocator *local_90;
  UMatData *pUStack_88;
  MatSize local_80;
  size_t *local_78;
  size_t local_70 [2];
  _InputArray local_60;
  _InputArray local_48;
  
  local_158.width = 0;
  local_158.height = 0;
  lStack_150 = 0;
  local_148 = 0;
  local_138 = image_points_list;
  local_130 = rvecs;
  local_128 = tvecs;
  std::vector<double,_std::allocator<double>_>::resize
            (image_reproj_errors,
             ((long)(object_points_list->
                    super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(object_points_list->
                    super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_1a0 = 0.0;
  lVar11 = 0;
  uVar12 = 0;
  iVar5 = 0;
  while( true ) {
    iVar4 = cv::Mat::total();
    if ((long)iVar4 <= (long)uVar12) break;
    if (((idx->flags & 0x4000) == 0) && (piVar6 = (idx->size).p, *piVar6 != 1)) {
      if (piVar6[1] == 1) {
        piVar6 = (int *)(idx->data + *(idx->step).p * uVar12);
      }
      else {
        uVar8 = (ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff;
        piVar6 = (int *)(idx->data +
                        (long)(int)((long)uVar8 % (long)idx->cols) * 4 +
                        (long)(int)((long)uVar8 / (long)idx->cols) * *(idx->step).p);
      }
    }
    else {
      piVar6 = (int *)(idx->data + lVar11);
    }
    iVar4 = *piVar6;
    register0x00000000 =
         (object_points_list->
         super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + iVar4;
    local_b0.width = 0;
    local_b0.height = 0;
    local_c0._0_4_ = -0x7efcffeb;
    local_110.width = 0;
    local_110.height = 0;
    local_120._0_4_ = -0x7dfcfff3;
    unique0x00004e80 = &local_158;
    local_170.obj =
         (local_130->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start + iVar4;
    local_170.sz.width = 0;
    local_170.sz.height = 0;
    local_170.flags = 0x1010000;
    local_188.obj =
         (local_128->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start + iVar4;
    local_188.sz.width = 0;
    local_188.sz.height = 0;
    local_188.flags = 0x1010000;
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x1010000;
    local_48.obj = camera_matrix;
    dVar13 = *(double *)xi->data;
    local_60.sz.width = 0;
    local_60.sz.height = 0;
    local_60.flags = 0x1010000;
    local_60.obj = distort_coeffs;
    p_Var7 = (_OutputArray *)cv::noArray();
    cv::omnidir::projectPoints
              ((_InputArray *)local_c0,(_OutputArray *)local_120,&local_170,&local_188,&local_48,
               dVar13,&local_60,p_Var7);
    pvVar1 = (local_138->
             super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c0._0_4_ = 0x42ff400d;
    local_c0._4_4_ = 2;
    uVar8 = (long)*(pointer *)
                   ((long)&pvVar1[iVar4].
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data + 8) -
            *(long *)&pvVar1[iVar4].
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data;
    stack0xffffffffffffff48 = (pointer)CONCAT44(1,(int)(uVar8 >> 3));
    local_80.p = (int *)(local_c0 + 8);
    local_90 = (MatAllocator *)0x0;
    pUStack_88 = (UMatData *)0x0;
    puStack_98 = (uchar *)0x0;
    SStack_a8.width = 0;
    SStack_a8.height = 0;
    local_78 = local_70;
    local_70[0] = 0;
    local_70[1] = 0;
    SVar2 = *(Size *)(pvVar1 + iVar4);
    if (SVar2 != *(Size *)((long)&pvVar1[iVar4].
                                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                  ._M_impl.super__Vector_impl_data + 8)) {
      local_70[1] = 8;
      local_70[0] = 8;
      puStack_98 = (uchar *)(((long)(uVar8 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U) +
                            (long)SVar2);
      SStack_a8 = SVar2;
    }
    local_170.sz.width = 0;
    local_170.sz.height = 0;
    local_170.flags = 0x1010000;
    local_170.obj = local_c0;
    local_120._0_4_ = 0x42ff400d;
    local_120._4_4_ = 2;
    stack0xfffffffffffffee8 = (Size *)CONCAT44(1,(int)((ulong)(lStack_150 - (long)local_158) >> 3));
    local_e0.p = (int *)(local_120 + 8);
    local_f0 = (MatAllocator *)0x0;
    pUStack_e8 = (UMatData *)0x0;
    puStack_f8 = (uchar *)0x0;
    SStack_108.width = 0;
    SStack_108.height = 0;
    local_d8 = local_d0;
    local_d0[0] = 0;
    local_d0[1] = 0;
    if (lStack_150 - (long)local_158 != 0) {
      local_d0[1] = 8;
      local_d0[0] = 8;
      SStack_108 = local_158;
      puStack_f8 = (uchar *)(((lStack_150 - (long)local_158) * 0x20000000 >> 0x1d &
                             0xfffffffffffffff8U) + (long)local_158);
    }
    local_188.sz.width = 0;
    local_188.sz.height = 0;
    local_188.flags = 0x1010000;
    local_188.obj = local_120;
    local_110 = SStack_108;
    local_100 = puStack_f8;
    local_b0 = SStack_a8;
    local_a0 = puStack_98;
    p_Var9 = (_InputArray *)cv::noArray();
    dVar13 = (double)cv::norm(&local_170,&local_188,4,p_Var9);
    cv::Mat::~Mat((Mat *)local_120);
    cv::Mat::~Mat((Mat *)local_c0);
    pvVar3 = (object_points_list->
             super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar10 = (int)((ulong)((long)*(pointer *)
                                  ((long)&pvVar3[iVar4].
                                          super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                          *(long *)&pvVar3[iVar4].
                                    super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                    ._M_impl.super__Vector_impl_data) >> 2) * -0x55555555;
    dVar14 = (dVar13 * dVar13) / (double)iVar10;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    (image_reproj_errors->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[iVar4] = dVar14;
    local_1a0 = local_1a0 + dVar13 * dVar13;
    iVar5 = iVar5 + iVar10;
    uVar12 = uVar12 + 1;
    lVar11 = lVar11 + 4;
  }
  local_1a0 = local_1a0 / (double)iVar5;
  if (local_1a0 < 0.0) {
    local_1a0 = sqrt(local_1a0);
  }
  else {
    local_1a0 = SQRT(local_1a0);
  }
  if (local_158 != (Size)0x0) {
    operator_delete((void *)local_158);
  }
  return local_1a0;
}

Assistant:

double computeReprojectionErrors(
    const std::vector<std::vector<cv::Point3f>>& object_points_list,
    const std::vector<std::vector<cv::Point2f>>& image_points_list,
    const std::vector<cv::Mat>& rvecs,
    const std::vector<cv::Mat>& tvecs,
    const cv::Mat& idx,
    const cv::Mat& camera_matrix,
    const cv::Mat& xi,
    const cv::Mat& distort_coeffs,
    std::vector<double>& image_reproj_errors
  ) {
    std::vector<cv::Point2f> image_points2;
    int total_points = 0;
    double total_error = 0;
    
    image_reproj_errors.resize(object_points_list.size());
    for (int k = 0;  k < (int)idx.total(); ++k) {
      int i = idx.at<int>(k);
      cv::omnidir::projectPoints(
	object_points_list[i],
	image_points2,
	rvecs[i],
	tvecs[i],
	camera_matrix,
	xi.at<double>(0),
	distort_coeffs
      );
      
      double err = cv::norm(
	cv::Mat(image_points_list[i]),
	cv::Mat(image_points2),
	cv::NORM_L2
      );
      int n = (int)object_points_list[i].size();
      image_reproj_errors[i] = (double)std::sqrt(err*err/n);
      total_error += err*err;
      total_points += n;
    }

    return std::sqrt(total_error/total_points);
  }